

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# KcpWithTcpServer.cpp
# Opt level: O1

void __thiscall
sznet::net::KcpWithTcpServer::removeConnection(KcpWithTcpServer *this,TcpConnectionPtr *conn)

{
  KcpTcpEventLoop *this_00;
  element_type *peVar1;
  _Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *p_Var2;
  _Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *__tmp;
  _Any_data local_48;
  code *pcStack_38;
  code *pcStack_30;
  
  this_00 = this->m_loop;
  peVar1 = (conn->super___shared_ptr<sznet::net::TcpConnection,_(__gnu_cxx::_Lock_policy)2>)._M_ptr;
  p_Var2 = (conn->super___shared_ptr<sznet::net::TcpConnection,_(__gnu_cxx::_Lock_policy)2>).
           _M_refcount._M_pi;
  if (p_Var2 != (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0) {
    if (__libc_single_threaded == '\0') {
      LOCK();
      p_Var2->_M_use_count = p_Var2->_M_use_count + 1;
      UNLOCK();
    }
    else {
      p_Var2->_M_use_count = p_Var2->_M_use_count + 1;
    }
  }
  local_48._M_unused._M_object = (void *)0x0;
  local_48._8_8_ = 0;
  pcStack_38 = (code *)0x0;
  pcStack_30 = (code *)0x0;
  local_48._M_unused._M_object = operator_new(0x28);
  *(code **)local_48._M_unused._0_8_ = removeConnectionInLoop;
  *(undefined8 *)((long)local_48._M_unused._0_8_ + 8) = 0;
  *(element_type **)((long)local_48._M_unused._0_8_ + 0x10) = peVar1;
  *(_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> **)((long)local_48._M_unused._0_8_ + 0x18) = p_Var2
  ;
  *(KcpWithTcpServer **)((long)local_48._M_unused._0_8_ + 0x20) = this;
  pcStack_30 = std::
               _Function_handler<void_(),_std::_Bind<void_(sznet::net::KcpWithTcpServer::*(sznet::net::KcpWithTcpServer_*,_std::shared_ptr<sznet::net::TcpConnection>))(const_std::shared_ptr<sznet::net::TcpConnection>_&)>_>
               ::_M_invoke;
  pcStack_38 = std::
               _Function_handler<void_(),_std::_Bind<void_(sznet::net::KcpWithTcpServer::*(sznet::net::KcpWithTcpServer_*,_std::shared_ptr<sznet::net::TcpConnection>))(const_std::shared_ptr<sznet::net::TcpConnection>_&)>_>
               ::_M_manager;
  EventLoop::runInLoop(&this_00->super_EventLoop,(Functor *)&local_48);
  if (pcStack_38 != (code *)0x0) {
    (*pcStack_38)(&local_48,&local_48,__destroy_functor);
  }
  return;
}

Assistant:

void KcpWithTcpServer::removeConnection(const TcpConnectionPtr& conn)
{
	// FIXME: unsafe
	m_loop->runInLoop(std::bind(&KcpWithTcpServer::removeConnectionInLoop, this, conn));
}